

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderStructTests.cpp
# Opt level: O0

int __thiscall deqp::ShaderStructCase::init(ShaderStructCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  Texture2D *pTVar2;
  Texture2D *pTVar3;
  PixelBufferAccess *access;
  Vector<float,_4> local_d4;
  Sampler local_c4;
  TextureBinding local_88;
  Vector<float,_4> local_3c;
  Vector<float,_4> local_2c;
  ShaderStructCase *local_10;
  ShaderStructCase *this_local;
  
  local_10 = this;
  if ((this->m_usesTexture & 1U) != 0) {
    pTVar2 = (Texture2D *)operator_new(0x70);
    glu::Texture2D::Texture2D(pTVar2,(this->super_ShaderRenderCase).m_renderCtx,0x8058,0x80,0x80);
    this->m_gradientTexture = pTVar2;
    pTVar3 = glu::Texture2D::getRefTexture(this->m_gradientTexture);
    tcu::Texture2D::allocLevel(pTVar3,0);
    pTVar3 = glu::Texture2D::getRefTexture(this->m_gradientTexture);
    access = tcu::TextureLevelPyramid::getLevel(&pTVar3->super_TextureLevelPyramid,0);
    tcu::Vector<float,_4>::Vector(&local_2c,0.0);
    tcu::Vector<float,_4>::Vector(&local_3c,1.0);
    tcu::fillWithComponentGradients(access,&local_2c,&local_3c);
    (*this->m_gradientTexture->_vptr_Texture2D[2])();
    pTVar2 = this->m_gradientTexture;
    tcu::Vector<float,_4>::Vector(&local_d4,0.0,0.0,0.0,0.0);
    tcu::Sampler::Sampler
              (&local_c4,CLAMP_TO_EDGE,CLAMP_TO_EDGE,CLAMP_TO_EDGE,LINEAR,LINEAR,0.0,true,
               COMPAREMODE_NONE,0,&local_d4,false,MODE_DEPTH);
    TextureBinding::TextureBinding(&local_88,pTVar2,&local_c4);
    ctx = (EVP_PKEY_CTX *)&local_88;
    std::vector<deqp::TextureBinding,_std::allocator<deqp::TextureBinding>_>::push_back
              (&(this->super_ShaderRenderCase).m_textures,(value_type *)ctx);
  }
  iVar1 = ShaderRenderCase::init(&this->super_ShaderRenderCase,ctx);
  return iVar1;
}

Assistant:

void ShaderStructCase::init(void)
{
	if (m_usesTexture)
	{
		m_gradientTexture = new glu::Texture2D(m_renderCtx, GL_RGBA8, 128, 128);

		m_gradientTexture->getRefTexture().allocLevel(0);
		tcu::fillWithComponentGradients(m_gradientTexture->getRefTexture().getLevel(0), tcu::Vec4(0.0f),
										tcu::Vec4(1.0f));
		m_gradientTexture->upload();

		m_textures.push_back(TextureBinding(
			m_gradientTexture, tcu::Sampler(tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE,
											tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::LINEAR, tcu::Sampler::LINEAR)));
		DE_ASSERT(m_textures.size() == 1);
	}
	ShaderRenderCase::init();
}